

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O2

void __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::SignalTimeDependent
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,SignalArray_const<int> *arr,string *name)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  Signal((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)&this->field_0x40,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x12c7d0;
  *(undefined8 *)&this->field_0x40 = 0x12c940;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,(SignalBase<int> *)&this->field_0x40,arr,
             TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x12c7d0;
  *(undefined8 *)&this->field_0x40 = 0x12c940;
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    const SignalArray_const<Time> &arr, std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, arr) {}